

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O2

void D_AddDirectory(TArray<FString,_FString> *wadfiles,char *dir)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  size_t __n;
  void *handle;
  size_t sVar4;
  findstate_t findstate;
  char skindir [4096];
  char curdir [4096];
  
  pcVar3 = getcwd(curdir,0x1000);
  if (pcVar3 != (char *)0x0) {
    __n = strlen((char *)wadfiles);
    memcpy(skindir,wadfiles,__n);
    skindir[__n] = '\0';
    sVar4 = __n;
    if (skindir[__n - 1] == '/') {
      sVar4 = __n - 1;
      skindir[__n - 1] = '\0';
    }
    iVar1 = chdir(skindir);
    if (iVar1 == 0) {
      skindir[sVar4] = '/';
      handle = I_FindFirst("*.wad",&findstate);
      if (handle != (void *)0xffffffffffffffff) {
        do {
          uVar2 = I_FindAttr(&findstate);
          if ((uVar2 & 8) == 0) {
            strcpy(skindir + sVar4 + 1,findstate.namelist[findstate.current]->d_name);
            D_AddFile(&allwads,skindir,true,-1);
          }
          iVar1 = I_FindNext(handle,&findstate);
        } while (iVar1 == 0);
        I_FindClose(handle);
      }
    }
    chdir(curdir);
  }
  return;
}

Assistant:

static void D_AddDirectory (TArray<FString> &wadfiles, const char *dir)
{
	char curdir[PATH_MAX];

	if (getcwd (curdir, PATH_MAX))
	{
		char skindir[PATH_MAX];
		findstate_t findstate;
		void *handle;
		size_t stuffstart;

		stuffstart = strlen (dir);
		memcpy (skindir, dir, stuffstart*sizeof(*dir));
		skindir[stuffstart] = 0;

		if (skindir[stuffstart-1] == '/')
		{
			skindir[--stuffstart] = 0;
		}

		if (!chdir (skindir))
		{
			skindir[stuffstart++] = '/';
			if ((handle = I_FindFirst ("*.wad", &findstate)) != (void *)-1)
			{
				do
				{
					if (!(I_FindAttr (&findstate) & FA_DIREC))
					{
						strcpy (skindir + stuffstart, I_FindName (&findstate));
						D_AddFile (wadfiles, skindir);
					}
				} while (I_FindNext (handle, &findstate) == 0);
				I_FindClose (handle);
			}
		}
		chdir (curdir);
	}
}